

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::FocusWindow(ImGuiWindow *window)

{
  ImVector<ImGuiWindow_*> *this;
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiWindow *pIVar3;
  value_type *ppIVar4;
  int i;
  int i_00;
  ImGuiWindow *in_RDI;
  ImGuiContext *g;
  long lVar5;
  ImGuiWindow *local_30;
  
  pIVar2 = GImGui;
  GImGui->FocusedWindow = in_RDI;
  if (in_RDI != (ImGuiWindow *)0x0) {
    local_30 = in_RDI;
    if (in_RDI->RootWindow != (ImGuiWindow *)0x0) {
      local_30 = in_RDI->RootWindow;
    }
    pIVar3 = local_30;
    uVar1 = local_30->Flags;
    if (((((uVar1 >> 0x19 & 1) != 0) && (pIVar2->ActiveId != 0)) &&
        (pIVar2->ActiveIdWindow != (ImGuiWindow *)0x0)) &&
       (pIVar2->ActiveIdWindow->RootWindow != local_30)) {
      pIVar2->ActiveId = 0;
      pIVar2->ActiveIdIsJustActivated = true;
      pIVar2->ActiveIdAllowOverlap = false;
      pIVar2->ActiveIdWindow = (ImGuiWindow *)0x0;
    }
    if ((uVar1 >> 0xd & 1) == 0) {
      this = &pIVar2->Windows;
      ppIVar4 = ImVector<ImGuiWindow_*>::back(this);
      if (*ppIVar4 != pIVar3) {
        lVar5 = 0;
        for (i_00 = 0; i_00 < this->Size; i_00 = i_00 + 1) {
          ppIVar4 = ImVector<ImGuiWindow_*>::operator[](this,i_00);
          if (*ppIVar4 == pIVar3) {
            ImVector<ImGuiWindow_*>::erase
                      (this,(const_iterator)(lVar5 + (long)(pIVar2->Windows).Data));
            break;
          }
          lVar5 = lVar5 + 8;
        }
        ImVector<ImGuiWindow_*>::push_back(this,&local_30);
      }
    }
  }
  return;
}

Assistant:

void ImGui::FocusWindow(ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;

    // Always mark the window we passed as focused. This is used for keyboard interactions such as tabbing.
    g.FocusedWindow = window;

    // Passing NULL allow to disable keyboard focus
    if (!window)
        return;

    // And move its root window to the top of the pile
    if (window->RootWindow)
        window = window->RootWindow;

    // Steal focus on active widgets
    if (window->Flags & ImGuiWindowFlags_Popup) // FIXME: This statement should be unnecessary. Need further testing before removing it..
        if (g.ActiveId != 0 && g.ActiveIdWindow && g.ActiveIdWindow->RootWindow != window)
            SetActiveID(0);

    // Bring to front
    if ((window->Flags & ImGuiWindowFlags_NoBringToFrontOnFocus) || g.Windows.back() == window)
        return;
    for (int i = 0; i < g.Windows.Size; i++)
        if (g.Windows[i] == window)
        {
            g.Windows.erase(g.Windows.begin() + i);
            break;
        }
    g.Windows.push_back(window);
}